

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_header.hpp
# Opt level: O3

bool __thiscall
ELFIO::elf_header_impl<ELFIO::Elf32_Ehdr>::save
          (elf_header_impl<ELFIO::Elf32_Ehdr> *this,ostream *stream)

{
  long lVar1;
  long lVar2;
  const_iterator __begin2;
  pointer paVar3;
  long lVar4;
  
  paVar3 = (this->translator->addr_translations).
           super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0;
  do {
    if (paVar3 == (this->translator->addr_translations).
                  super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001044b1:
      std::ostream::seekp(stream,lVar4,0);
      std::ostream::write((char *)stream,(long)&this->header);
      return *(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0;
    }
    lVar1 = *(long *)paVar3;
    if ((lVar1 < 1) &&
       (lVar2 = *(long *)(paVar3 + 0x10),
       lVar2 != -lVar1 && SBORROW8(lVar2,-lVar1) == lVar2 + lVar1 < 0)) {
      lVar4 = *(long *)(paVar3 + 0x20) - lVar1;
      goto LAB_001044b1;
    }
    paVar3 = paVar3 + 0x30;
  } while( true );
}

Assistant:

bool save( std::ostream& stream ) const override
    {
        stream.seekp( ( *translator )[0] );
        stream.write( reinterpret_cast<const char*>( &header ),
                      sizeof( header ) );

        return stream.good();
    }